

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O0

Vector3d * ear::toCartesianVector3d(Vector3d *__return_storage_ptr__,SpeakerPosition *position)

{
  type_conflict in_R8B;
  boost local_19;
  SpeakerPosition *local_18;
  SpeakerPosition *position_local;
  
  local_18 = position;
  position_local = (SpeakerPosition *)__return_storage_ptr__;
  boost::
  apply_visitor<ear::toCartesianVector3d(boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>)::__0,boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>&>
            (__return_storage_ptr__,&local_19,(type *)position,
             (variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> *)0x1,in_R8B);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d toCartesianVector3d(SpeakerPosition position) {
    return boost::apply_visitor(
        [](const auto& p) { return toCartesianVector3d(p); }, position);
  }